

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_atomics_op(JSContext *ctx,JSValue this_obj,int argc,JSValue *argv,int op)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  ulong uVar7;
  uint uVar8;
  double dVar9;
  ulong uVar10;
  uint8_t v1;
  byte bVar11;
  byte bVar12;
  ushort uVar13;
  uint32_t uVar14;
  int64_t iVar15;
  bool bVar16;
  JSValue JVar17;
  uint32_t v32;
  JSClassID class_id;
  int size_log2;
  JSArrayBuffer *abuf;
  
  puVar6 = (uint *)js_atomics_get_ptr(ctx,&abuf,&size_log2,&class_id,*argv,argv[1],0);
  iVar15 = 6;
  uVar8 = 0;
  if (puVar6 == (uint *)0x0) {
LAB_0015a242:
    uVar10 = 0;
    uVar7 = 0;
    goto LAB_0015a366;
  }
  uVar14 = 0;
  if (op != 7) {
    iVar4 = JS_ToInt32(ctx,(int32_t *)&v32,argv[2]);
    uVar14 = v32;
    if (iVar4 == 0) {
      if (op == 6) {
        iVar4 = JS_ToInt32(ctx,(int32_t *)&v32,argv[3]);
        uVar8 = v32;
        if (iVar4 != 0) goto LAB_0015a242;
      }
      else {
        uVar8 = 0;
      }
      if (abuf->detached == '\0') goto LAB_0015a1b0;
      JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
    }
    goto LAB_0015a242;
  }
LAB_0015a1b0:
  bVar11 = (byte)uVar14;
  uVar3 = (ushort)uVar14;
  switch(size_log2 << 3 | op) {
  case 1:
    bVar12 = (byte)*puVar6;
    do {
      LOCK();
      bVar1 = (byte)*puVar6;
      bVar16 = bVar12 == bVar1;
      if (bVar16) {
        *(byte *)puVar6 = bVar12 & bVar11;
        bVar1 = bVar12;
      }
      bVar12 = bVar1;
      UNLOCK();
    } while (!bVar16);
    goto LAB_0015a2ec;
  case 2:
    bVar12 = (byte)*puVar6;
    do {
      LOCK();
      bVar1 = (byte)*puVar6;
      bVar16 = bVar12 == bVar1;
      if (bVar16) {
        *(byte *)puVar6 = bVar12 | bVar11;
        bVar1 = bVar12;
      }
      bVar12 = bVar1;
      UNLOCK();
    } while (!bVar16);
    goto LAB_0015a2ec;
  case 3:
    uVar14 = (uint32_t)(byte)-bVar11;
  case 0:
    LOCK();
    bVar12 = (byte)*puVar6;
    *(byte *)puVar6 = (byte)*puVar6 + (char)uVar14;
    UNLOCK();
    goto LAB_0015a2d4;
  case 4:
    bVar12 = (byte)*puVar6;
    do {
      LOCK();
      bVar1 = (byte)*puVar6;
      bVar16 = bVar12 == bVar1;
      if (bVar16) {
        *(byte *)puVar6 = bVar12 ^ bVar11;
        bVar1 = bVar12;
      }
      bVar12 = bVar1;
      UNLOCK();
    } while (!bVar16);
    goto LAB_0015a2ec;
  case 5:
    LOCK();
    bVar12 = (byte)*puVar6;
    *(byte *)puVar6 = bVar11;
    UNLOCK();
LAB_0015a2d4:
    uVar5 = (uint)bVar12;
    break;
  case 6:
    LOCK();
    if (bVar11 == (byte)*puVar6) {
      *(byte *)puVar6 = (byte)uVar8;
    }
    else {
      uVar14 = (uint32_t)(byte)*puVar6;
    }
    bVar12 = (byte)uVar14;
    UNLOCK();
    goto LAB_0015a2ec;
  case 7:
    bVar12 = (byte)*puVar6;
LAB_0015a2ec:
    uVar5 = (uint)bVar12;
    break;
  case 9:
    uVar13 = (ushort)*puVar6;
    do {
      LOCK();
      uVar2 = (ushort)*puVar6;
      bVar16 = uVar13 == uVar2;
      if (bVar16) {
        *(ushort *)puVar6 = uVar13 & uVar3;
        uVar2 = uVar13;
      }
      uVar13 = uVar2;
      UNLOCK();
    } while (!bVar16);
    goto LAB_0015a30d;
  case 10:
    uVar13 = (ushort)*puVar6;
    do {
      LOCK();
      uVar2 = (ushort)*puVar6;
      bVar16 = uVar13 == uVar2;
      if (bVar16) {
        *(ushort *)puVar6 = uVar13 | uVar3;
        uVar2 = uVar13;
      }
      uVar13 = uVar2;
      UNLOCK();
    } while (!bVar16);
    goto LAB_0015a30d;
  case 0xb:
    uVar14 = -uVar14;
  case 8:
    LOCK();
    uVar13 = (ushort)*puVar6;
    *(ushort *)puVar6 = (ushort)*puVar6 + (short)uVar14;
    UNLOCK();
    goto LAB_0015a2e1;
  case 0xc:
    uVar13 = (ushort)*puVar6;
    do {
      LOCK();
      uVar2 = (ushort)*puVar6;
      bVar16 = uVar13 == uVar2;
      if (bVar16) {
        *(ushort *)puVar6 = uVar13 ^ uVar3;
        uVar2 = uVar13;
      }
      uVar13 = uVar2;
      UNLOCK();
    } while (!bVar16);
LAB_0015a30d:
    uVar5 = (uint)uVar13;
    break;
  case 0xd:
    LOCK();
    uVar13 = (ushort)*puVar6;
    *(ushort *)puVar6 = uVar3;
    UNLOCK();
LAB_0015a2e1:
    uVar5 = (uint)uVar13;
    break;
  case 0xe:
    LOCK();
    if (uVar3 == (ushort)*puVar6) {
      *(ushort *)puVar6 = (ushort)uVar8;
    }
    else {
      uVar14 = (uint32_t)(ushort)*puVar6;
    }
    uVar3 = (ushort)uVar14;
    UNLOCK();
    goto LAB_0015a2a2;
  case 0xf:
    uVar3 = (ushort)*puVar6;
LAB_0015a2a2:
    uVar5 = (uint)uVar3;
    break;
  case 0x11:
    uVar5 = *puVar6;
    do {
      LOCK();
      uVar8 = *puVar6;
      bVar16 = uVar5 == uVar8;
      if (bVar16) {
        *puVar6 = uVar5 & uVar14;
        uVar8 = uVar5;
      }
      uVar5 = uVar8;
      UNLOCK();
    } while (!bVar16);
    break;
  case 0x12:
    uVar8 = *puVar6;
    do {
      LOCK();
      uVar5 = *puVar6;
      bVar16 = uVar8 == uVar5;
      if (bVar16) {
        *puVar6 = uVar8 | uVar14;
        uVar5 = uVar8;
      }
      UNLOCK();
      uVar8 = uVar5;
    } while (!bVar16);
    break;
  case 0x13:
    uVar14 = -uVar14;
  case 0x10:
    LOCK();
    uVar5 = *puVar6;
    *puVar6 = *puVar6 + uVar14;
    UNLOCK();
    break;
  case 0x14:
    uVar8 = *puVar6;
    do {
      LOCK();
      uVar5 = *puVar6;
      bVar16 = uVar8 == uVar5;
      if (bVar16) {
        *puVar6 = uVar8 ^ uVar14;
        uVar5 = uVar8;
      }
      UNLOCK();
      uVar8 = uVar5;
    } while (!bVar16);
    break;
  case 0x15:
    LOCK();
    uVar5 = *puVar6;
    *puVar6 = uVar14;
    UNLOCK();
    break;
  case 0x16:
    LOCK();
    uVar5 = *puVar6;
    if (uVar14 == uVar5) {
      *puVar6 = uVar8;
      uVar5 = uVar14;
    }
    UNLOCK();
    break;
  case 0x17:
    uVar5 = *puVar6;
    break;
  default:
    goto switchD_0015a1d1_default;
  }
  switch(class_id) {
  case 0x16:
    uVar5 = (uint)(char)uVar5;
    break;
  case 0x17:
    uVar5 = uVar5 & 0xff;
    break;
  case 0x18:
    uVar5 = (uint)(short)uVar5;
    break;
  case 0x19:
    uVar5 = uVar5 & 0xffff;
    break;
  case 0x1a:
    break;
  case 0x1b:
    dVar9 = (double)uVar5;
    if (-1 < (int)uVar5) {
      dVar9 = (double)(ulong)uVar5;
    }
    iVar15 = 7;
    if (-1 < (int)uVar5) {
      iVar15 = 0;
    }
    goto LAB_0015a357;
  default:
switchD_0015a1d1_default:
    abort();
  }
  dVar9 = (double)(ulong)uVar5;
  iVar15 = 0;
LAB_0015a357:
  uVar7 = (ulong)dVar9 & 0x7fffffff00000000;
  uVar10 = (ulong)dVar9 & 0xffffffff;
LAB_0015a366:
  JVar17.tag = iVar15;
  JVar17.u.ptr = (void *)(uVar10 | uVar7);
  return JVar17;
}

Assistant:

static JSValue js_atomics_op(JSContext *ctx,
                             JSValueConst this_obj,
                             int argc, JSValueConst *argv, int op)
{
    int size_log2;
#ifdef CONFIG_BIGNUM
    uint64_t v, a, rep_val;
#else
    uint32_t v, a, rep_val;
#endif
    void *ptr;
    JSValue ret;
    JSClassID class_id;
    JSArrayBuffer *abuf;

    ptr = js_atomics_get_ptr(ctx, &abuf, &size_log2, &class_id,
                             argv[0], argv[1], 0);
    if (!ptr)
        return JS_EXCEPTION;
    rep_val = 0;
    if (op == ATOMICS_OP_LOAD) {
        v = 0;
    } else {
#ifdef CONFIG_BIGNUM
        if (size_log2 == 3) {
            int64_t v64;
            if (JS_ToBigInt64(ctx, &v64, argv[2]))
                return JS_EXCEPTION;
            v = v64;
            if (op == ATOMICS_OP_COMPARE_EXCHANGE) {
                if (JS_ToBigInt64(ctx, &v64, argv[3]))
                    return JS_EXCEPTION;
                rep_val = v64;
            }
        } else
#endif
        {
                uint32_t v32;
                if (JS_ToUint32(ctx, &v32, argv[2]))
                    return JS_EXCEPTION;
                v = v32;
                if (op == ATOMICS_OP_COMPARE_EXCHANGE) {
                    if (JS_ToUint32(ctx, &v32, argv[3]))
                        return JS_EXCEPTION;
                    rep_val = v32;
                }
        }
        if (abuf->detached)
            return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
   }

   switch(op | (size_log2 << 3)) {
            
#ifdef CONFIG_BIGNUM
#define OP(op_name, func_name)                          \
    case ATOMICS_OP_ ## op_name | (0 << 3):             \
       a = func_name((_Atomic(uint8_t) *)ptr, v);       \
       break;                                           \
    case ATOMICS_OP_ ## op_name | (1 << 3):             \
        a = func_name((_Atomic(uint16_t) *)ptr, v);     \
        break;                                          \
    case ATOMICS_OP_ ## op_name | (2 << 3):             \
        a = func_name((_Atomic(uint32_t) *)ptr, v);     \
        break;                                          \
    case ATOMICS_OP_ ## op_name | (3 << 3):             \
        a = func_name((_Atomic(uint64_t) *)ptr, v);     \
        break;
#else
#define OP(op_name, func_name)                          \
    case ATOMICS_OP_ ## op_name | (0 << 3):             \
       a = func_name((_Atomic(uint8_t) *)ptr, v);       \
       break;                                           \
    case ATOMICS_OP_ ## op_name | (1 << 3):             \
        a = func_name((_Atomic(uint16_t) *)ptr, v);     \
        break;                                          \
    case ATOMICS_OP_ ## op_name | (2 << 3):             \
        a = func_name((_Atomic(uint32_t) *)ptr, v);     \
        break;
#endif
        OP(ADD, atomic_fetch_add)
        OP(AND, atomic_fetch_and)
        OP(OR, atomic_fetch_or)
        OP(SUB, atomic_fetch_sub)
        OP(XOR, atomic_fetch_xor)
        OP(EXCHANGE, atomic_exchange)
#undef OP

    case ATOMICS_OP_LOAD | (0 << 3):
        a = atomic_load((_Atomic(uint8_t) *)ptr);
        break;
    case ATOMICS_OP_LOAD | (1 << 3):
        a = atomic_load((_Atomic(uint16_t) *)ptr);
        break;
    case ATOMICS_OP_LOAD | (2 << 3):
        a = atomic_load((_Atomic(uint32_t) *)ptr);
        break;
#ifdef CONFIG_BIGNUM
    case ATOMICS_OP_LOAD | (3 << 3):
        a = atomic_load((_Atomic(uint64_t) *)ptr);
        break;
#endif
        
    case ATOMICS_OP_COMPARE_EXCHANGE | (0 << 3):
        {
            uint8_t v1 = v;
            atomic_compare_exchange_strong((_Atomic(uint8_t) *)ptr, &v1, rep_val);
            a = v1;
        }
        break;
    case ATOMICS_OP_COMPARE_EXCHANGE | (1 << 3):
        {
            uint16_t v1 = v;
            atomic_compare_exchange_strong((_Atomic(uint16_t) *)ptr, &v1, rep_val);
            a = v1;
        }
        break;
    case ATOMICS_OP_COMPARE_EXCHANGE | (2 << 3):
        {
            uint32_t v1 = v;
            atomic_compare_exchange_strong((_Atomic(uint32_t) *)ptr, &v1, rep_val);
            a = v1;
        }
        break;
#ifdef CONFIG_BIGNUM
    case ATOMICS_OP_COMPARE_EXCHANGE | (3 << 3):
        {
            uint64_t v1 = v;
            atomic_compare_exchange_strong((_Atomic(uint64_t) *)ptr, &v1, rep_val);
            a = v1;
        }
        break;
#endif
    default:
        abort();
    }

    switch(class_id) {
    case JS_CLASS_INT8_ARRAY:
        a = (int8_t)a;
        goto done;
    case JS_CLASS_UINT8_ARRAY:
        a = (uint8_t)a;
        goto done;
    case JS_CLASS_INT16_ARRAY:
        a = (int16_t)a;
        goto done;
    case JS_CLASS_UINT16_ARRAY:
        a = (uint16_t)a;
        goto done;
    case JS_CLASS_INT32_ARRAY:
    done:
        ret = JS_NewInt32(ctx, a);
        break;
    case JS_CLASS_UINT32_ARRAY:
        ret = JS_NewUint32(ctx, a);
        break;
#ifdef CONFIG_BIGNUM
    case JS_CLASS_BIG_INT64_ARRAY:
        ret = JS_NewBigInt64(ctx, a);
        break;
    case JS_CLASS_BIG_UINT64_ARRAY:
        ret = JS_NewBigUint64(ctx, a);
        break;
#endif
    default:
        abort();
    }
    return ret;
}